

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

Vec_Str_t *
Bmc_CollapseOne_int2
          (sat_solver *pSat1,sat_solver *pSat2,int nVars,int nCubeLim,int nBTLimit,int fCanon,
          int fReverse,int fVerbose)

{
  sat_solver *psVar1;
  Vec_Str_t *pVVar2;
  char Entry;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *vNums_00;
  Vec_Int_t *vTemp;
  int *piVar6;
  abctime aVar7;
  int *end;
  char *pStr;
  int fProfile;
  int iLit;
  int iCiVarBeg;
  int iOOVars [2];
  int iOutVar;
  int fComplete [2];
  abctime Time [2] [2];
  abctime clk;
  int status;
  int Start;
  int iCube;
  int pLits [2];
  int iVar;
  int v;
  int n;
  Vec_Int_t *vCube;
  Vec_Int_t *vNums;
  Vec_Int_t *vLits;
  Vec_Int_t *vVars;
  Vec_Str_t *vRes;
  Vec_Str_t *vSop [2];
  sat_solver *pSat [2];
  int fVeryVerbose;
  int fCanon_local;
  int nBTLimit_local;
  int nCubeLim_local;
  int nVars_local;
  sat_solver *pSat2_local;
  sat_solver *pSat1_local;
  
  vSop[1] = (Vec_Str_t *)pSat1;
  vRes = Vec_StrAlloc(1000);
  vSop[0] = Vec_StrAlloc(1000);
  vVars = (Vec_Int_t *)0x0;
  p = Vec_IntAlloc(nVars + 1);
  p_00 = Vec_IntAlloc(nVars + 1);
  vNums_00 = Vec_IntAlloc(nVars + 1);
  vTemp = Vec_IntAlloc(nVars + 1);
  status = 0;
  Time[1][1] = 0;
  memset(fComplete,0,0x20);
  memset(iOOVars + 1,0,8);
  iOOVars[0] = 2;
  _iLit = 0x100000000;
  if (fReverse == 0) {
    for (pLits[1] = 0; pLits[1] < nVars; pLits[1] = pLits[1] + 1) {
      Vec_IntPush(p,pLits[1] + 3);
    }
  }
  else {
    for (pLits[1] = nVars + -1; -1 < pLits[1]; pLits[1] = pLits[1] + -1) {
      Vec_IntPush(p,pLits[1] + 3);
    }
  }
  for (iVar = 0; iVar < 2; iVar = iVar + 1) {
    Start = Abc_Var2Lit(iOOVars[0],iVar);
    iVar3 = sat_solver_solve((sat_solver *)vSop[(long)iVar + 1],&Start,&iCube,(long)nBTLimit,0,0,0);
    if (iVar3 == 0) goto LAB_006e5909;
    if (iVar3 == -1) {
      Vec_StrClear(vRes);
      pStr = " 0\n";
      if (iVar != 0) {
        pStr = " 1\n";
      }
      Vec_StrPrintStr(vRes,pStr);
      Vec_StrPush(vRes,'\0');
      iOOVars[1] = 1;
      goto LAB_006e5909;
    }
    iVar3 = sat_solver_addclause((sat_solver *)vSop[(long)iVar + 1],&Start,&iCube);
    if (iVar3 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x4f7,
                    "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                   );
    }
    Vec_StrPush(vSop[(long)iVar + -1],'\0');
  }
  for (status = 0; nCubeLim == 0 || status < nCubeLim; status = status + 1) {
    for (iVar = 0; iVar < 2; iVar = iVar + 1) {
      if (fVerbose != 0) {
        Time[1][1] = Abc_Clock();
      }
      psVar1 = (sat_solver *)vSop[(long)iVar + 1];
      piVar6 = Vec_IntArray(p);
      iVar3 = Vec_IntSize(p);
      sat_solver_clean_polarity(psVar1,piVar6,iVar3);
      Start = Abc_Var2Lit((&iLit)[iVar],1);
      iVar3 = sat_solver_solve((sat_solver *)vSop[(long)iVar + 1],&Start,&iCube,0,0,0,0);
      if (fVerbose != 0) {
        aVar7 = Abc_Clock();
        Time[(long)iVar + -1][1] = (aVar7 - Time[1][1]) + Time[(long)iVar + -1][1];
      }
      if (iVar3 == 0) goto LAB_006e5909;
      if (iVar3 == -1) {
        iOOVars[(long)iVar + 1] = 1;
        break;
      }
      Vec_IntClear(p_00);
      for (pLits[1] = 0; iVar3 = pLits[1], iVar4 = Vec_IntSize(p), iVar3 < iVar4;
          pLits[1] = pLits[1] + 1) {
        iVar3 = Vec_IntEntry(p,pLits[1]);
        pLits[0] = iVar3;
        iVar4 = sat_solver_var_value((sat_solver *)vSop[(long)iVar + 1],iVar3);
        iVar3 = Abc_Var2Lit(iVar3,(uint)((iVar4 != 0 ^ 0xffU) & 1));
        Vec_IntPush(p_00,iVar3);
      }
      if (fVerbose != 0) {
        Time[1][1] = Abc_Clock();
      }
      iVar3 = Bmc_CollapseExpand((sat_solver *)vSop[(long)(int)(uint)((iVar != 0 ^ 0xffU) & 1) + 1],
                                 (sat_solver *)0x0,p_00,vNums_00,vTemp,nBTLimit,fCanon,-1);
      if (fVerbose != 0) {
        aVar7 = Abc_Clock();
        Time[iVar][0] = (aVar7 - Time[1][1]) + Time[iVar][0];
      }
      if (iVar3 < 0) goto LAB_006e5909;
      Vec_StrPop(vSop[(long)iVar + -1]);
      iVar3 = Vec_StrSize(vSop[(long)iVar + -1]);
      Vec_StrFillExtra(vSop[(long)iVar + -1],iVar3 + nVars + 4,'-');
      Vec_StrWriteEntry(vSop[(long)iVar + -1],iVar3 + nVars,' ');
      Entry = '1';
      if (iVar != 0) {
        Entry = '0';
      }
      Vec_StrWriteEntry(vSop[(long)iVar + -1],iVar3 + nVars + 1,Entry);
      Vec_StrWriteEntry(vSop[(long)iVar + -1],iVar3 + nVars + 2,'\n');
      Vec_StrWriteEntry(vSop[(long)iVar + -1],iVar3 + nVars + 3,'\0');
      Vec_IntClear(vTemp);
      iVar4 = Abc_Var2Lit((&iLit)[iVar],0);
      Vec_IntPush(vTemp,iVar4);
      for (pLits[1] = 0; iVar4 = pLits[1], iVar5 = Vec_IntSize(vNums_00), iVar4 < iVar5;
          pLits[1] = pLits[1] + 1) {
        pLits[0] = Vec_IntEntry(vNums_00,pLits[1]);
        iVar4 = Vec_IntEntry(p_00,pLits[0]);
        iVar5 = Abc_LitNot(iVar4);
        Vec_IntPush(vTemp,iVar5);
        if (fReverse == 0) {
          pVVar2 = vSop[(long)iVar + -1];
          iVar5 = iVar3 + pLits[0];
          iVar4 = Abc_LitIsCompl(iVar4);
          Vec_StrWriteEntry(pVVar2,iVar5,((iVar4 != 0 ^ 0xffU) & 1) + 0x30);
        }
        else {
          pVVar2 = vSop[(long)iVar + -1];
          iVar5 = (iVar3 + nVars) - pLits[0];
          iVar4 = Abc_LitIsCompl(iVar4);
          Vec_StrWriteEntry(pVVar2,iVar5 + -1,((iVar4 != 0 ^ 0xffU) & 1) + 0x30);
        }
      }
      psVar1 = (sat_solver *)vSop[(long)iVar + 1];
      piVar6 = Vec_IntArray(vTemp);
      end = Vec_IntLimit(vTemp);
      iVar3 = sat_solver_addclause(psVar1,piVar6,end);
      if (iVar3 == 0) {
        iOOVars[(long)iVar + 1] = 1;
        break;
      }
      if (iVar3 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                      ,0x536,
                      "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                     );
      }
    }
    if ((iOOVars[1] != 0) || (iOutVar != 0)) break;
  }
LAB_006e5909:
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  Vec_IntFree(vNums_00);
  Vec_IntFree(vTemp);
  if ((iOOVars[1] != 0) && (iOutVar != 0)) {
    __assert_fail("!fComplete[0] || !fComplete[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x540,
                  "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                 );
  }
  if ((iOOVars[1] != 0) || (iOutVar != 0)) {
    vVars = (Vec_Int_t *)vSop[(long)iOutVar + -1];
    vSop[(long)iOutVar + -1] = (Vec_Str_t *)0x0;
    if (1 < status) {
      iVar3 = Vec_StrSize((Vec_Str_t *)vVars);
      Bmc_CollapseIrredundantFull((Vec_Str_t *)vVars,iVar3 / (nVars + 3),nVars);
    }
  }
  if (fVerbose != 0) {
    printf("Processed output with %d supp vars. ",(ulong)(uint)nVars);
    if (vVars == (Vec_Int_t *)0x0) {
      printf("The resulting SOP exceeded %d cubes.\n",(ulong)(uint)nCubeLim);
    }
    else {
      iVar3 = Vec_StrSize((Vec_Str_t *)vVars);
      printf("The best cover contains %d cubes.\n",(long)iVar3 / (long)(nVars + 3) & 0xffffffff,
             (long)iVar3 % (long)(nVars + 3) & 0xffffffff);
    }
    Abc_PrintTime(1,"Onset  minterm",(abctime)fComplete);
    Abc_PrintTime(1,"Onset  expand ",Time[0][0]);
    Abc_PrintTime(1,"Offset minterm",Time[0][1]);
    Abc_PrintTime(1,"Offset expand ",Time[1][0]);
  }
  Vec_StrFreeP(&vRes);
  Vec_StrFreeP(vSop);
  return (Vec_Str_t *)vVars;
}

Assistant:

Vec_Str_t * Bmc_CollapseOne_int2( sat_solver * pSat1, sat_solver * pSat2, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    sat_solver * pSat[2] = { pSat1, pSat2 };
    Vec_Str_t * vSop[2]  = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vVars = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars+1 );
    int n, v, iVar, pLits[2], iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};
    // variables
    int iOutVar    = 2;
    int iOOVars[2] = {0, 1};
//    int iOutVar    = 1;
//    int iOOVars[2] = {sat_solver_nvars(pSat) - 5, sat_solver_nvars(pSat) - 5 + 1};

    // collect CI variables (0 = onset enable, 1 = offset enable, 2 = output)
    int iCiVarBeg = 3;
//    int iCiVarBeg = sat_solver_nvars(pSat) - 5 - nVars;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        pLits[0] = Abc_Var2Lit( iOutVar, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat[n], pLits, pLits + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // add literals to the solver
        status = sat_solver_addclause( pSat[n], pLits, pLits + 1 );
        assert( status );
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            sat_solver_clean_polarity( pSat[n], Vec_IntArray(vVars), Vec_IntSize(vVars) );
            pLits[0] = Abc_Var2Lit( iOOVars[n], 1 ); // enable clauses
//            pLits[1] = Abc_Var2Lit( iOutVar, n );    // set output
//            status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
            status = sat_solver_solve( pSat[n], pLits, pLits + 1, 0, 0, 0, 0 );
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntForEachEntry( vVars, iVar, v )
                Vec_IntPush( vLits, Abc_Var2Lit(iVar, !sat_solver_var_value(pSat[n], iVar)) );
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
//            status = Bmc_CollapseExpand( pSat, NULL, vLits, vNums, vCube, nBTLimit, fCanon, Abc_Var2Lit(iOutVar, !n) );
            status = Bmc_CollapseExpand( pSat[!n], NULL, vLits, vNums, vCube, nBTLimit, fCanon, -1 );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntPush( vCube, Abc_Var2Lit( iOOVars[n], 0 ) );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                int iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
//            status = sat_solver_addclause( pSat, Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            status = sat_solver_addclause( pSat[n], Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}